

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall libcellml::Importer::replaceModel(Importer *this,ModelPtr *model,string *key)

{
  LoggerImpl *pLVar1;
  size_type sVar2;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *this_00;
  string normalisedKey;
  string sStack_38;
  
  normaliseDirectorySeparator(&sStack_38,key);
  pLVar1 = Logger::pFunc(&this->super_Logger);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
                   *)&pLVar1[1].mErrors.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish,&sStack_38);
  if (sVar2 != 0) {
    pLVar1 = Logger::pFunc(&this->super_Logger);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Model>_>_>_>
                             *)&pLVar1[1].mErrors.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish,&sStack_38)->
               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::__cxx11::string::~string((string *)&sStack_38);
  return sVar2 != 0;
}

Assistant:

bool Importer::replaceModel(const ModelPtr &model, const std::string &key)
{
    auto normalisedKey = normaliseDirectorySeparator(key);
    if (pFunc()->mLibrary.count(normalisedKey) == 0) {
        // If the key is not found, do nothing.
        return false;
    }
    pFunc()->mLibrary[normalisedKey] = model;
    return true;
}